

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_tests.cpp
# Opt level: O0

void __thiscall PerformanceTest::long_test(PerformanceTest *this)

{
  time_t tVar1;
  uint64_t key;
  time_t tVar2;
  ostream *poVar3;
  allocator<char> local_259;
  string local_258;
  int local_234;
  undefined1 local_230 [4];
  int i;
  ofstream os;
  time_t new_time;
  time_t cur_time;
  time_t start_time;
  int put_ps;
  int max;
  PerformanceTest *this_local;
  
  start_time._0_4_ = 0;
  tVar1 = time((time_t *)0x0);
  std::ofstream::ofstream(local_230,"long_test.txt",_S_out);
  new_time = tVar1;
  for (local_234 = 0; local_234 < 10000000; local_234 = local_234 + 1) {
    key = (uint64_t)local_234;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,10000,'s',&local_259);
    KVStore::put(&(this->super_Test).store,key,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
    start_time._0_4_ = (int)start_time + 1;
    tVar2 = time((time_t *)0x0);
    if (tVar2 - new_time == 1) {
      poVar3 = (ostream *)std::ostream::operator<<(local_230,tVar2 - tVar1);
      poVar3 = std::operator<<(poVar3,' ');
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)start_time);
      std::operator<<(poVar3,'\n');
      start_time._0_4_ = 0;
      new_time = tVar2;
    }
  }
  std::ofstream::~ofstream(local_230);
  return;
}

Assistant:

void long_test() {
        auto max = 10000000;
        auto put_ps = 0;
        auto start_time = time(nullptr);
        auto cur_time = start_time;
        auto new_time = start_time;
        auto os = std::ofstream{"long_test.txt"};
        for (int i = 0; i < max; i++) {
            store.put(i, std::string(10000, 's'));
            put_ps++;
            new_time = time(nullptr);
            if (new_time - cur_time == 1) {
                os << new_time - start_time << ' ' << put_ps << '\n';
                put_ps = 0;
                cur_time = new_time;
            }
        }
    }